

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

bool __thiscall Parsing::File::createFile(File *this)

{
  bool bVar1;
  ofstream f;
  
  bVar1 = isFile(this);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    std::ofstream::ofstream(&f,(string *)&this->_path,_S_out);
    std::ofstream::close();
    bVar1 = isFile(this);
    std::ofstream::~ofstream(&f);
  }
  return bVar1;
}

Assistant:

bool File::createFile() const noexcept
    {
        if (isFile())
            return false;

        std::ofstream f(_path);
        f.close();

        if (!isFile())
            return false;

        return true;
    }